

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseParser.cpp
# Opt level: O2

void __thiscall phpconvert::BaseParser::BaseParser(BaseParser *this)

{
  this->_vptr_BaseParser = (_func_int **)&PTR__BaseParser_00143c40;
  (this->sourceDir)._M_dataplus._M_p = (pointer)&(this->sourceDir).field_2;
  (this->sourceDir)._M_string_length = 0;
  (this->sourceDir).field_2._M_local_buf[0] = '\0';
  (this->outputDir)._M_dataplus._M_p = (pointer)&(this->outputDir).field_2;
  (this->outputDir)._M_string_length = 0;
  (this->outputDir).field_2._M_local_buf[0] = '\0';
  this->recursive = false;
  return;
}

Assistant:

BaseParser::BaseParser() {
        setRecursive(false);
    }